

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

void __thiscall ON_OffsetSurface::ON_OffsetSurface(ON_OffsetSurface *this,ON_OffsetSurface *src)

{
  ON_Surface *pOVar1;
  
  ON_SurfaceProxy::ON_SurfaceProxy(&this->super_ON_SurfaceProxy,&src->super_ON_SurfaceProxy);
  (this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00828fa0;
  this->m__pSrf = (ON_Surface *)0x0;
  ON_OffsetSurfaceFunction::ON_OffsetSurfaceFunction
            (&this->m_offset_function,&src->m_offset_function);
  if (src->m__pSrf != (ON_Surface *)0x0) {
    pOVar1 = ON_SurfaceProxy::DuplicateSurface(&src->super_ON_SurfaceProxy);
    this->m__pSrf = pOVar1;
    ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pOVar1);
  }
  pOVar1 = ON_SurfaceProxy::ProxySurface(&this->super_ON_SurfaceProxy);
  ON_OffsetSurfaceFunction::SetBaseSurface(&this->m_offset_function,pOVar1);
  return;
}

Assistant:

ON_OffsetSurface::ON_OffsetSurface( const ON_OffsetSurface& src)
                 : ON_SurfaceProxy(src),
                   m__pSrf(0),
                   m_offset_function(src.m_offset_function)
{
  if ( 0 != src.m__pSrf )
  {
    m__pSrf = src.ON_SurfaceProxy::DuplicateSurface();
    SetProxySurface(m__pSrf);
  }
  m_offset_function.SetBaseSurface( BaseSurface() );
}